

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1HighbdCompMaskPredTest_CheckOutput_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1HighbdCompMaskPredTest_CheckOutput_Test>
           *this)

{
  AV1HighbdCompMaskPredTest *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int,unsigned_char_const*,int,int),BLOCK_SIZE,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (AV1HighbdCompMaskPredTest *)operator_new(0x48);
  anon_unknown.dwarf_180f112::AV1HighbdCompMaskPredTest::AV1HighbdCompMaskPredTest(this_00);
  (this_00->super_AV1HighbdCompMaskPredTestBase).super_Test._vptr_Test =
       (_func_int **)&PTR__AV1HighbdCompMaskPredTest_00f499a8;
  (this_00->
  super_WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE,_int>_>
  )._vptr_WithParamInterface =
       (_func_int **)&PTR__AV1HighbdCompMaskPredTest_CheckOutput_Test_00f499e8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }